

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

UInt32 CountDefinedBits(Byte *bits,UInt32 numItems)

{
  UInt32 local_20;
  int local_1c;
  UInt32 sum;
  uint m;
  Byte b;
  byte *pbStack_10;
  UInt32 numItems_local;
  Byte *bits_local;
  
  sum._3_1_ = 0;
  local_1c = 0;
  local_20 = 0;
  pbStack_10 = bits;
  for (m = numItems; m != 0; m = m - 1) {
    if (local_1c == 0) {
      sum._3_1_ = *pbStack_10;
      local_1c = 8;
      pbStack_10 = pbStack_10 + 1;
    }
    local_1c = local_1c + -1;
    local_20 = ((int)(uint)sum._3_1_ >> ((byte)local_1c & 0x1f) & 1U) + local_20;
  }
  return local_20;
}

Assistant:

static UInt32 CountDefinedBits(const Byte *bits, UInt32 numItems)
{
  Byte b = 0;
  unsigned m = 0;
  UInt32 sum = 0;
  for (; numItems != 0; numItems--)
  {
    if (m == 0)
    {
      b = *bits++;
      m = 8;
    }
    m--;
    sum += ((b >> m) & 1);
  }
  return sum;
}